

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O0

Array<asl::Array<asl::Var>_> __thiscall asl::TabularDataFile::data(TabularDataFile *this)

{
  bool bVar1;
  int in_ECX;
  void *__child_stack;
  TabularDataFile *in_RSI;
  void *in_R8;
  Array<asl::Var> local_38 [3];
  undefined1 local_19;
  TabularDataFile *this_local;
  Array<asl::Array<asl::Var>_> *data;
  
  local_19 = 0;
  this_local = this;
  Array<asl::Array<asl::Var>_>::Array((Array<asl::Array<asl::Var>_> *)this);
  while (bVar1 = nextRow(in_RSI), bVar1) {
    Array<asl::Var>::clone(local_38,(__fn *)&in_RSI->_row,__child_stack,in_ECX,in_R8);
    Array<asl::Array<asl::Var>_>::operator<<((Array<asl::Array<asl::Var>_> *)this,local_38);
    Array<asl::Var>::~Array(local_38);
  }
  return (Array<asl::Array<asl::Var>_>)(Array<asl::Var> *)this;
}

Assistant:

Array<Array<Var> > TabularDataFile::data()
{
	Array<Array<Var> > data;

	while(nextRow())
	{
		data << _row.clone();
	}
	return data;
}